

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

bool __thiscall
boost::ext::ut::v1_1_8::runner<ApprovalTests::cfg::reporter,_16>::on<bool>
          (runner<ApprovalTests::cfg::reporter,_16> *this,assertion<bool> assertion)

{
  anon_struct_16_2_3fa459c6_for_asserts_ *paVar1;
  assertion_fail<bool> assertion_00;
  bool bVar2;
  undefined4 uStack_1c;
  undefined4 local_13;
  undefined2 local_f;
  undefined1 local_d;
  
  bVar2 = true;
  if (this->dry_run_ == false) {
    if (assertion.expr != true) {
      this->fails_ = this->fails_ + 1;
      assertion_00.location._12_4_ = uStack_1c;
      assertion_00.location.line_ = assertion.location.line_;
      assertion_00._1_4_ = local_13;
      assertion_00.expr = assertion.expr;
      assertion_00._5_2_ = local_f;
      assertion_00._7_1_ = local_d;
      assertion_00.location.file_ = assertion.location.file_;
      reporter<boost::ext::ut::v1_1_8::printer>::on<bool>
                ((reporter<boost::ext::ut::v1_1_8::printer> *)this,assertion_00);
    }
    else {
      paVar1 = &(this->reporter_).super_reporter<boost::ext::ut::v1_1_8::printer>.asserts_;
      paVar1->pass = paVar1->pass + 1;
    }
    bVar2 = assertion.expr == true;
  }
  return bVar2;
}

Assistant:

[[nodiscard]] auto on(events::assertion<TExpr> assertion) -> bool {
      if (dry_run_) {
        return true;
      }

      if (static_cast<bool>(assertion.expr)) {
        reporter_.on(events::assertion_pass<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return true;
      } else {
        ++fails_;
        reporter_.on(events::assertion_fail<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return false;
      }
    }